

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac.c
# Opt level: O0

int omac_imit_final(EVP_MD_CTX *ctx,uchar *md)

{
  int iVar1;
  void *in_RSI;
  undefined8 in_RDI;
  size_t mac_size;
  uchar mac [16];
  OMAC_CTX *c;
  char *in_stack_ffffffffffffffb8;
  uchar local_38 [24];
  undefined8 *local_20;
  void *local_18;
  uint local_4;
  
  local_18 = in_RSI;
  local_20 = (undefined8 *)EVP_MD_CTX_get0_md_data(in_RDI);
  iVar1 = *(int *)(local_20 + 3);
  if (iVar1 != 0) {
    CMAC_Final((CMAC_CTX *)*local_20,local_38,(size_t *)&stack0xffffffffffffffc0);
    memcpy(local_18,local_38,local_20[1]);
  }
  else {
    ERR_GOST_error(0,0x10,in_stack_ffffffffffffffb8,0);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

static int omac_imit_final(EVP_MD_CTX *ctx, unsigned char *md)
{
    OMAC_CTX *c = EVP_MD_CTX_md_data(ctx);
    unsigned char mac[MAX_GOST_OMAC_SIZE];
    size_t mac_size = sizeof(mac);

    if (!c->key_set) {
        GOSTerr(GOST_F_OMAC_IMIT_FINAL, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    CMAC_Final(c->cmac_ctx, mac, &mac_size);

    memcpy(md, mac, c->dgst_size);
    return 1;
}